

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O2

bool __thiscall QtMWidgets::ProgressBarPrivate::repaintRequired(ProgressBarPrivate *this)

{
  Orientation OVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  QRect QVar6;
  
  iVar4 = this->value - this->lastPaintedValue;
  if (iVar4 == 0) {
    return false;
  }
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  OVar1 = this->orientation;
  QVar6 = grooveRect(this);
  bVar5 = OVar1 == Horizontal;
  uVar3 = QVar6._8_8_ >> 0x20;
  if (bVar5) {
    uVar3 = QVar6._8_8_;
  }
  iVar4 = QVar6.y1;
  if (bVar5) {
    iVar4 = QVar6.x1;
  }
  return this->maximum - this->minimum < (((int)uVar3 - iVar4) + 1) * iVar2;
}

Assistant:

bool
ProgressBarPrivate::repaintRequired() const
{
	if( value == lastPaintedValue )
		return false;

	const int valueDifference = qAbs( value - lastPaintedValue );

	const int grooveBlock = ( orientation == Qt::Horizontal ? grooveRect().width() :
		grooveRect().height() );

	// This expression is basically
	// ( valueDifference / 1 > ( maximum - minimum ) / grooveBlock )
	// transformed to avoid integer division.
	return ( valueDifference * grooveBlock > ( maximum - minimum ) );
}